

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

Expression
dynet::detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
          (initializer_list<dynet::Expression> *xs)

{
  undefined4 uVar1;
  vector<dynet::Node*,std::allocator<dynet::Node*>> *this;
  size_type sVar2;
  iterator pEVar3;
  iterator __position;
  undefined4 uVar4;
  Node *pNVar5;
  pointer puVar6;
  long lVar7;
  Expression EVar8;
  VariableIndex new_node_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_3d;
  undefined4 local_3c;
  Node *local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  this = (vector<dynet::Node*,std::allocator<dynet::Node*>> *)xs->_M_array->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,xs->_M_len,(allocator_type *)&local_38);
  sVar2 = xs->_M_len;
  if (sVar2 != 0) {
    pEVar3 = xs->_M_array;
    lVar7 = 0;
    puVar6 = local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *puVar6 = *(uint *)((long)&pEVar3->i + lVar7);
      puVar6 = puVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (sVar2 << 4 != lVar7);
  }
  local_3c = (undefined4)((ulong)(*(long *)(this + 8) - *(long *)this) >> 3);
  pNVar5 = (Node *)operator_new(0x68);
  *(undefined **)pNVar5 = &std::bad_cast::typeinfo;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)(pNVar5 + 8),
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_3d);
  *(undefined8 *)(pNVar5 + 0x3c) = 0x100000000;
  *(undefined8 *)(pNVar5 + 0x48) = 0;
  *(code **)pNVar5 = std::__throw_length_error;
  __position._M_current = *(Node ***)(this + 8);
  local_38 = pNVar5;
  if (__position._M_current == *(Node ***)(this + 0x10)) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              (this,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar5;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  *(undefined8 *)(*(long *)(*(long *)(this + 8) + -8) + 0x48) = default_device;
  dynet::ComputationGraph::set_dim_for_new_node((uint *)this);
  uVar4 = local_3c;
  uVar1 = *(undefined4 *)(this + 0x38);
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  EVar8.graph_id = uVar1;
  EVar8.i = uVar4;
  EVar8.pg = (ComputationGraph *)this;
  return EVar8;
}

Assistant:

Expression f(const T& xs) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis));
}